

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromBinaryWithSize(uchar *value,size_t size)

{
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  uchar *in_RDI;
  SimpleString SVar2;
  size_t displayedSize;
  SimpleString *result;
  SimpleString *in_stack_ffffffffffffff98;
  SimpleString *size_00;
  SimpleString *this;
  uchar *value_00;
  char *in_stack_ffffffffffffffb8;
  SimpleString *in_stack_ffffffffffffffc0;
  
  value_00 = in_RDI;
  StringFromFormat((char *)in_RDI,"Size = %u | HexContents = ",(ulong)in_RDX & 0xffffffff);
  size_00 = in_RDX;
  if ((SimpleString *)0x80 < in_RDX) {
    size_00 = (SimpleString *)0x80;
  }
  this = size_00;
  StringFromBinaryOrNull(value_00,(size_t)size_00);
  SimpleString::operator+=(this,in_stack_ffffffffffffff98);
  SimpleString::~SimpleString((SimpleString *)0x113486);
  sVar1 = extraout_RDX;
  if (size_00 < in_RDX) {
    SimpleString::operator+=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar1 = extraout_RDX_00;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

SimpleString StringFromBinaryWithSize(const unsigned char* value, size_t size)
{
    SimpleString result = StringFromFormat("Size = %u | HexContents = ", (unsigned) size);
    size_t displayedSize = ((size > 128) ? 128 : size);
    result += StringFromBinaryOrNull(value, displayedSize);
    if (size > displayedSize)
    {
        result += " ...";
    }
    return result;
}